

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O3

void __thiscall
EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction
          (EnvironmentNAVXYTHETALATTICE *this,EnvNAVXYTHETALATAction_t *action)

{
  pointer *ppsVar1;
  int iVar2;
  pointer psVar3;
  iterator iVar4;
  pointer psVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  sbpl_xy_theta_cell_t local_50;
  sbpl_xy_theta_cell_t local_40;
  
  uVar13 = 0;
  local_50.x = 0;
  local_50.y = 0;
  local_40.x = 0;
  local_40.y = 0;
  local_40.theta = 0;
  psVar5 = (action->intersectingcellsV).
           super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (long)(action->intersectingcellsV).
                super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)psVar5 >> 3;
  if (0 < (int)uVar9) {
    do {
      local_50.theta = (int)action->starttheta;
      uVar10 = uVar13;
      if (uVar9 <= uVar13) goto LAB_00125ef1;
      iVar12 = -psVar5[uVar13].x;
      iVar7 = -psVar5[uVar13].y;
      local_50.y = iVar7;
      local_50.x = iVar12;
      if (this->bUseNonUniformAngles == true) {
        local_40.theta =
             (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
        iVar7 = local_50.y;
        iVar12 = local_50.x;
      }
      else {
        iVar11 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
        local_40.theta = (int)action->endtheta % iVar11;
        if (action->endtheta < '\0') {
          local_40.theta = (local_40.theta + iVar11) % iVar11;
        }
      }
      local_40.x = action->dX + iVar12;
      local_40.y = action->dY + iVar7;
      psVar3 = (this->affectedsuccstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
      uVar8 = (uint)uVar10;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
LAB_00125a83:
        if ((uint)uVar9 == uVar8) goto LAB_00125a88;
      }
      else {
        piVar6 = &psVar3->theta;
        uVar9 = 0;
        do {
          if (uVar10 - uVar9 == 0) goto LAB_00125ef1;
          if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_40.x) &&
              (piVar6[-1] == local_40.y)) && (*piVar6 == local_40.theta)) goto LAB_00125a83;
          uVar9 = uVar9 + 1;
          piVar6 = piVar6 + 3;
        } while ((uVar8 & 0x7fffffff) != uVar9);
LAB_00125a88:
        if (iVar4._M_current ==
            (this->affectedsuccstatesV).
            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
          _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                    ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                     &this->affectedsuccstatesV,iVar4,&local_40);
        }
        else {
          (iVar4._M_current)->theta = local_40.theta;
          (iVar4._M_current)->x = local_40.x;
          (iVar4._M_current)->y = local_40.y;
          ppsVar1 = &(this->affectedsuccstatesV).
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      psVar3 = (this->affectedpredstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar4._M_current =
           (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
      uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
      uVar8 = (uint)uVar10;
      if ((int)uVar8 < 1) {
        uVar9 = 0;
LAB_00125b21:
        if ((uint)uVar9 == uVar8) goto LAB_00125b26;
      }
      else {
        piVar6 = &psVar3->theta;
        uVar9 = 0;
        do {
          if (uVar10 - uVar9 == 0) goto LAB_00125ef1;
          if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_50.x) &&
              (piVar6[-1] == local_50.y)) && (*piVar6 == local_50.theta)) goto LAB_00125b21;
          uVar9 = uVar9 + 1;
          piVar6 = piVar6 + 3;
        } while ((uVar8 & 0x7fffffff) != uVar9);
LAB_00125b26:
        if (iVar4._M_current ==
            (this->affectedpredstatesV).
            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
          _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                    ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                     &this->affectedpredstatesV,iVar4,&local_50);
        }
        else {
          (iVar4._M_current)->theta = local_50.theta;
          (iVar4._M_current)->x = local_50.x;
          (iVar4._M_current)->y = local_50.y;
          ppsVar1 = &(this->affectedpredstatesV).
                     super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      uVar13 = uVar13 + 1;
      psVar5 = (action->intersectingcellsV).
               super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(action->intersectingcellsV).
                     super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)psVar5;
      uVar9 = (long)uVar10 >> 3;
    } while ((long)uVar13 < (long)(int)(uVar10 >> 3));
  }
  local_50.theta = (int)action->starttheta;
  local_50.x = 0;
  local_50.y = 0;
  if (this->bUseNonUniformAngles == false) {
    iVar12 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_40.theta = (int)action->endtheta % iVar12;
    local_40.y = 0;
    if (action->endtheta < '\0') {
      local_40.theta = (local_40.theta + iVar12) % iVar12;
    }
  }
  else {
    local_40.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
    local_40.y = local_50.y;
  }
  local_40.x = action->dX + local_50.x;
  local_40.y = action->dY + local_40.y;
  psVar3 = (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4._M_current =
       (this->affectedsuccstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
LAB_00125c4d:
    if ((uint)uVar9 == uVar8) goto LAB_00125c52;
  }
  else {
    piVar6 = &psVar3->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125ef1;
      if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_40.x) && (piVar6[-1] == local_40.y))
         && (*piVar6 == local_40.theta)) goto LAB_00125c4d;
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
LAB_00125c52:
    if (iVar4._M_current ==
        (this->affectedsuccstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedsuccstatesV,iVar4,&local_40);
    }
    else {
      (iVar4._M_current)->theta = local_40.theta;
      (iVar4._M_current)->x = local_40.x;
      (iVar4._M_current)->y = local_40.y;
      ppsVar1 = &(this->affectedsuccstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  psVar3 = (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4._M_current =
       (this->affectedpredstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
LAB_00125cf2:
    if ((uint)uVar9 == uVar8) goto LAB_00125cf7;
  }
  else {
    piVar6 = &psVar3->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125ef1;
      if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_50.x) && (piVar6[-1] == local_50.y))
         && (*piVar6 == local_50.theta)) goto LAB_00125cf2;
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
LAB_00125cf7:
    if (iVar4._M_current ==
        (this->affectedpredstatesV).
        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
      _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
                ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
                 &this->affectedpredstatesV,iVar4,&local_50);
    }
    else {
      (iVar4._M_current)->theta = local_50.theta;
      (iVar4._M_current)->x = local_50.x;
      (iVar4._M_current)->y = local_50.y;
      ppsVar1 = &(this->affectedpredstatesV).
                 super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
  }
  local_50.theta = (int)action->starttheta;
  iVar7 = (int)action->dX;
  iVar11 = (int)action->dY;
  iVar12 = -iVar11;
  local_50.y = iVar12;
  local_50.x = -iVar7;
  if (this->bUseNonUniformAngles == true) {
    local_40.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
    iVar7 = (int)action->dX;
    iVar11 = (int)action->dY;
    iVar12 = local_50.y;
  }
  else {
    iVar2 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_40.theta = (int)action->endtheta % iVar2;
    if (action->endtheta < '\0') {
      local_40.theta = (local_40.theta + iVar2) % iVar2;
    }
  }
  local_40.y = iVar11 + iVar12;
  local_40.x = iVar7 + local_50.x;
  psVar3 = (this->affectedsuccstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4._M_current =
       (this->affectedsuccstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
LAB_00125e0a:
    if ((uint)uVar9 != uVar8) goto LAB_00125e3e;
  }
  else {
    piVar6 = &psVar3->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) goto LAB_00125ef1;
      if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_40.x) && (piVar6[-1] == local_40.y))
         && (*piVar6 == local_40.theta)) goto LAB_00125e0a;
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  if (iVar4._M_current ==
      (this->affectedsuccstatesV).
      super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
    _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
              ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
               &this->affectedsuccstatesV,iVar4,&local_40);
  }
  else {
    (iVar4._M_current)->theta = local_40.theta;
    (iVar4._M_current)->x = local_40.x;
    (iVar4._M_current)->y = local_40.y;
    ppsVar1 = &(this->affectedsuccstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppsVar1 = *ppsVar1 + 1;
  }
LAB_00125e3e:
  psVar3 = (this->affectedpredstatesV).
           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4._M_current =
       (this->affectedpredstatesV).
       super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar10 = ((long)iVar4._M_current - (long)psVar3 >> 2) * -0x5555555555555555;
  uVar8 = (uint)uVar10;
  if ((int)uVar8 < 1) {
    uVar9 = 0;
LAB_00125ea4:
    if ((uint)uVar9 != uVar8) {
      return;
    }
  }
  else {
    piVar6 = &psVar3->theta;
    uVar9 = 0;
    do {
      if (uVar10 - uVar9 == 0) {
LAB_00125ef1:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar10);
      }
      if (((((sbpl_xy_theta_cell_t *)(piVar6 + -2))->x == local_50.x) && (piVar6[-1] == local_50.y))
         && (*piVar6 == local_50.theta)) goto LAB_00125ea4;
      uVar9 = uVar9 + 1;
      piVar6 = piVar6 + 3;
    } while ((uVar8 & 0x7fffffff) != uVar9);
  }
  if (iVar4._M_current ==
      (this->affectedpredstatesV).
      super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>>::
    _M_realloc_insert<sbpl_xy_theta_cell_t_const&>
              ((vector<sbpl_xy_theta_cell_t,std::allocator<sbpl_xy_theta_cell_t>> *)
               &this->affectedpredstatesV,iVar4,&local_50);
  }
  else {
    (iVar4._M_current)->theta = local_50.theta;
    (iVar4._M_current)->x = local_50.x;
    (iVar4._M_current)->y = local_50.y;
    ppsVar1 = &(this->affectedpredstatesV).
               super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppsVar1 = *ppsVar1 + 1;
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction(
    EnvNAVXYTHETALATAction_t* action)
{
    int j;

    // iterate over all the cells involved in the action
    sbpl_xy_theta_cell_t startcell3d, endcell3d;
    for (int i = 0; i < (int)action->intersectingcellsV.size(); i++) {
        // compute the translated affected search Pose - what state has an
        // outgoing action whose intersecting cell is at 0,0
        startcell3d.theta = action->starttheta;
        startcell3d.x = -action->intersectingcellsV.at(i).x;
        startcell3d.y = -action->intersectingcellsV.at(i).y;

        // compute the translated affected search Pose - what state has an
        // incoming action whose intersecting cell is at 0,0
        if (bUseNonUniformAngles) {
            endcell3d.theta = normalizeDiscAngle(action->endtheta);
        }
        else {
            endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
        }
        endcell3d.x = startcell3d.x + action->dX;
        endcell3d.y = startcell3d.y + action->dY;

        //store the cells if not already there
        for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
            if (affectedsuccstatesV.at(j) == endcell3d) {
                break;
            }
        }
        if (j == (int)affectedsuccstatesV.size()) {
            affectedsuccstatesV.push_back(endcell3d);
        }

        for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
            if (affectedpredstatesV.at(j) == startcell3d) {
                break;
            }
        }
        if (j == (int)affectedpredstatesV.size()) {
            affectedpredstatesV.push_back(startcell3d);
        }
    } // over intersecting cells

    // add the centers since with h2d we are using these in cost computations
    // ---intersecting cell = origin
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -0;
    startcell3d.y = -0;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    //store the cells if not already there
    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }

    //---intersecting cell = outcome state
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -action->dX;
    startcell3d.y = -action->dY;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }
}